

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O2

BinarySectionOrder wabt::GetSectionOrder(BinarySection sec)

{
  if ((uint)sec < 0xe) {
    return *(BinarySectionOrder *)(&DAT_001db2fc + (ulong)(uint)sec * 4);
  }
  abort();
}

Assistant:

BinarySectionOrder GetSectionOrder(BinarySection sec) {
  switch (sec) {
#define V(Name, name, code) \
  case BinarySection::Name: \
    return BinarySectionOrder::Name;
    WABT_FOREACH_BINARY_SECTION(V)
#undef V
    default:
      WABT_UNREACHABLE;
  }
}